

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translucent_shader.cpp
# Opt level: O2

void gen_translucent_shade
               (float *ca,float *cr,float *cl,float *cp,float *l,float *e,float *norm,float p,
               float x,float y,float ds,float dd,float depth,float *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vec3 ci_total;
  vec3 ci;
  vec3 vthird;
  vec3 vsec;
  float local_e8 [4];
  float local_d8;
  float *local_c0;
  float *local_b8;
  float *local_b0;
  undefined8 local_a8;
  float local_a0;
  float local_98;
  float fStack_94;
  float local_90;
  float local_88;
  float fStack_84;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  float local_54 [3];
  float local_48 [3];
  float local_3c [3];
  
  local_d8 = ds;
  local_c0 = ca;
  local_b8 = cr;
  gen_lambert_shade(ca,cr,cl,norm,l,c);
  local_b0 = cp;
  gen_phong_shade(cl,cp,l,e,norm,(int)p,c);
  vec3_scale(c,c,dd);
  local_e8[2] = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_98 = (float)*(undefined8 *)norm - local_d8;
  fStack_94 = (float)((ulong)*(undefined8 *)norm >> 0x20) - depth;
  local_90 = norm[2];
  fVar1 = vec3_mul_inner(&local_98,&local_98);
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  vec3_scale(&local_98,&local_98,1.0 / fVar1);
  local_68 = fStack_94;
  fStack_64 = local_90;
  local_78 = ZEXT416((uint)local_98);
  uStack_60 = 0;
  local_88 = local_90;
  fStack_84 = local_98;
  uStack_80 = 0;
  for (fVar1 = 0.0; fVar1 < 6.2831855; fVar1 = fVar1 + 1.0) {
    fVar2 = (float)*(undefined8 *)(norm + 1);
    fVar3 = (float)((ulong)*(undefined8 *)(norm + 1) >> 0x20);
    local_a8 = CONCAT44(fVar3 * fStack_84 - *norm * fStack_64,fVar2 * local_88 - fVar3 * local_68);
    local_a0 = *norm * local_68 - (float)local_78._0_4_ * fVar2;
    fVar2 = sinf(fVar1);
    vec3_scale((float *)&local_a8,(float *)&local_a8,fVar2);
    fVar2 = cosf(fVar1);
    vec3_scale(local_3c,&local_98,fVar2);
    local_d8 = vec3_mul_inner(norm,&local_98);
    fVar2 = cosf(fVar1);
    vec3_scale(local_48,norm,(1.0 - fVar2) * local_d8);
    vec3_add((float *)&local_a8,(float *)&local_a8,local_3c);
    vec3_add((float *)&local_a8,(float *)&local_a8,local_48);
    gen_lambert_shade(local_c0,local_b8,cl,norm,(float *)&local_a8,local_54);
    gen_phong_shade(cl,local_b0,(float *)&local_a8,e,norm,(int)p,local_54);
    vec3_add(local_e8,local_e8,local_54);
  }
  vec3_scale(local_e8,local_e8,1.0 - dd);
  vec3_add(c,c,local_e8);
  return;
}

Assistant:

void gen_translucent_shade(const vec3 ca, const vec3 cr, const vec3 cl, const vec3 cp, vec3 l, const vec3 e, const vec3 norm, const float p,
float x, float y, const float ds, const float dd, const float depth, vec3 c){
    //cal diffuse and spec for inner and outer layer and blend
    gen_lambert_shade(ca, cr, cl, norm, l, c);
    gen_phong_shade(cl, cp, l, e, norm, p, c);
    vec3_scale(c, c, dd); //scale outer color by dimming with depth decay factor
    //apply BTDF to simulate a sum of subsurface source (a forward dipole)
    vec3 ci_total = {0.0f, 0.0f, 0.0f};

    vec3 vbase = {norm[0] - ds, norm[1] - depth, norm[2]}; //pick a subsurface source to start with, set our microfacet dipole to be ds unit away
    vec3_norm(vbase, vbase);
    //approximate an intergral of these subsurface sources
    for(float i = 0.0f; i < 2*PI; i+=1.0f){
        //find rotated vector around the normal by Rodrigue's rotation formula
        vec3 vrot;
        //first term
        vec3_mul_cross(vrot, norm, vbase);
        vec3_scale(vrot, vrot, sin(i));
        //second term
        vec3 vsec;
        vec3_scale(vsec, vbase, cos(i));
        //third term
        vec3 vthird;
        vec3_scale(vthird, norm, vec3_mul_inner(norm, vbase) * (1 - cos(i)) );
        //add and find rotated vec
        vec3_add(vrot, vrot, vsec);
        vec3_add(vrot, vrot, vthird);

        //calculate BTDF for this derivative
        vec3 ci;
        gen_lambert_shade(ca, cr, cl, norm, vrot, ci);
        gen_phong_shade(cl, cp, vrot, e, norm, p, ci);
        vec3_add(ci_total, ci_total, ci);
    }

    vec3_scale(ci_total, ci_total, 1 - dd); //preserve energy by culling with depth decay

    //composite
    vec3_add(c, c, ci_total);
}